

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

int mbedtls_poly1305_starts(mbedtls_poly1305_context *ctx,uchar *key)

{
  uchar *key_local;
  mbedtls_poly1305_context *ctx_local;
  
  ctx->r[0] = *(uint *)key & 0xfffffff;
  ctx->r[1] = *(uint *)(key + 4) & 0xffffffc;
  ctx->r[2] = *(uint *)(key + 8) & 0xffffffc;
  ctx->r[3] = *(uint *)(key + 0xc) & 0xffffffc;
  ctx->s[0] = *(uint32_t *)(key + 0x10);
  ctx->s[1] = *(uint32_t *)(key + 0x14);
  ctx->s[2] = *(uint32_t *)(key + 0x18);
  ctx->s[3] = *(uint32_t *)(key + 0x1c);
  ctx->acc[0] = 0;
  ctx->acc[1] = 0;
  ctx->acc[2] = 0;
  ctx->acc[3] = 0;
  ctx->acc[4] = 0;
  mbedtls_platform_zeroize(ctx->queue,0x10);
  ctx->queue_len = 0;
  return 0;
}

Assistant:

int mbedtls_poly1305_starts( mbedtls_poly1305_context *ctx,
                             const unsigned char key[32] )
{
    POLY1305_VALIDATE_RET( ctx != NULL );
    POLY1305_VALIDATE_RET( key != NULL );

    /* r &= 0x0ffffffc0ffffffc0ffffffc0fffffff */
    ctx->r[0] = BYTES_TO_U32_LE( key, 0 )  & 0x0FFFFFFFU;
    ctx->r[1] = BYTES_TO_U32_LE( key, 4 )  & 0x0FFFFFFCU;
    ctx->r[2] = BYTES_TO_U32_LE( key, 8 )  & 0x0FFFFFFCU;
    ctx->r[3] = BYTES_TO_U32_LE( key, 12 ) & 0x0FFFFFFCU;

    ctx->s[0] = BYTES_TO_U32_LE( key, 16 );
    ctx->s[1] = BYTES_TO_U32_LE( key, 20 );
    ctx->s[2] = BYTES_TO_U32_LE( key, 24 );
    ctx->s[3] = BYTES_TO_U32_LE( key, 28 );

    /* Initial accumulator state */
    ctx->acc[0] = 0U;
    ctx->acc[1] = 0U;
    ctx->acc[2] = 0U;
    ctx->acc[3] = 0U;
    ctx->acc[4] = 0U;

    /* Queue initially empty */
    mbedtls_platform_zeroize( ctx->queue, sizeof( ctx->queue ) );
    ctx->queue_len = 0U;

    return( 0 );
}